

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_b.h
# Opt level: O2

void arena_dalloc_large_no_tcache(tsdn_t *tsdn,void *ptr,szind_t szind)

{
  uintptr_t in_R8;
  rtree_t *rtree;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1b8;
  
  if (tsdn == (tsdn_t *)0x0) {
    rtree = (rtree_t *)&stack0xfffffffffffffe60;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
  }
  else {
    rtree = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&local_1b8,tsdn,rtree,(rtree_ctx_t *)ptr,in_R8);
  duckdb_je_large_dalloc(tsdn,local_1b8.edata);
  return;
}

Assistant:

static inline void
arena_dalloc_large_no_tcache(tsdn_t *tsdn, void *ptr, szind_t szind) {
	if (config_prof && unlikely(szind < SC_NBINS)) {
		arena_dalloc_promoted(tsdn, ptr, NULL, true);
	} else {
		edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global,
		    ptr);
		if (large_dalloc_safety_checks(edata, ptr, szind)) {
			/* See the comment in isfree. */
			return;
		}
		large_dalloc(tsdn, edata);
	}
}